

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O0

bool __thiscall FShader::Bind(FShader *this)

{
  FShader *this_local;
  
  FShaderManager::SetActiveShader(GLRenderer->mShaderManager,this);
  return true;
}

Assistant:

bool FShader::Bind()
{
	GLRenderer->mShaderManager->SetActiveShader(this);
	return true;
}